

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::PopAndCheckCall
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types,char *desc)

{
  Type *pTVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Type *pTVar5;
  
  RVar2 = CheckSignature(this,param_types,desc);
  RVar3 = DropTypes(this,(long)(param_types->
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(param_types->
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2);
  pTVar1 = (result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar5 = (result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    PushType(this,*pTVar5);
  }
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = RVar3.enum_ == Error || RVar2.enum_ == Error;
  return (Result)RVar4.enum_;
}

Assistant:

Result TypeChecker::PopAndCheckCall(const TypeVector& param_types,
                                    const TypeVector& result_types,
                                    const char* desc) {
  Result result = CheckSignature(param_types, desc);
  result |= DropTypes(param_types.size());
  PushTypes(result_types);
  return result;
}